

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::EndFunctionBody
          (BinaryReaderInterp *this,Index index)

{
  pointer *ppLVar1;
  Result RVar2;
  undefined8 in_RAX;
  Enum EVar3;
  Index keep_count;
  Index drop_count;
  undefined8 local_18;
  
  local_18 = in_RAX;
  FixupMap::Resolve(&this->depth_fixups_,this->istream_,
                    (int)((ulong)((long)(this->label_stack_).
                                        super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->label_stack_).
                                       super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
  RVar2 = GetReturnDropKeepCount(this,(Index *)((long)&local_18 + 4),(Index *)&local_18);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    RVar2 = SharedValidator::EndFunctionBody
                      (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc)
    ;
    if (RVar2.enum_ != Error) {
      Istream::EmitDropKeep(this->istream_,local_18._4_4_,(u32)local_18);
      Istream::Emit(this->istream_,Return);
      ppLVar1 = &(this->label_stack_).
                 super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppLVar1 = *ppLVar1 + -1;
      this->func_ = (FuncDesc *)0x0;
      EVar3 = Ok;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::EndFunctionBody(Index index) {
  FixupTopLabel();
  Index drop_count, keep_count;
  CHECK_RESULT(GetReturnDropKeepCount(&drop_count, &keep_count));
  CHECK_RESULT(validator_.EndFunctionBody(loc));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.Emit(Opcode::Return);
  PopLabel();
  func_ = nullptr;
  return Result::Ok;
}